

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O2

void __thiscall kj::_::BTreeImpl::reserve(BTreeImpl *this,size_t size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Fault f;
  DebugComparison<unsigned_long_&,_unsigned_int> _kjCondition;
  size_t size_local;
  
  _kjCondition.left = &size_local;
  _kjCondition.right = 0x80000000;
  _kjCondition.op.content.ptr = " < ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = (size & 0xffffffff80000000) == 0;
  size_local = size;
  if (_kjCondition.result) {
    uVar1 = (uint)((size & 0xffffffff) / 7);
    uVar2 = uVar1 | 1;
    uVar3 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = ((uVar3 ^ 0x1e) >> 1 ^ 0xf) + (int)((size & 0xffffffff) / 0x15) + uVar1 + 4;
    if (this->treeCapacity < uVar3) {
      growTree(this,uVar3);
    }
    return;
  }
  Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_int>&,char_const(&)[32]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
             ,0xdc,FAILED,"size < (1u << 31)","_kjCondition,\"b-tree has reached maximum size\"",
             &_kjCondition,(char (*) [32])"b-tree has reached maximum size");
  Debug::Fault::fatal(&f);
}

Assistant:

void BTreeImpl::reserve(size_t size) {
  KJ_REQUIRE(size < (1u << 31), "b-tree has reached maximum size");

  // Calculate the worst-case number of leaves to cover the size, given that a leaf is always at
  // least half-full. (Note that it's correct for this calculation to round down, not up: The
  // remainder will necessarily be distributed among the non-full leaves, rather than creating a
  // new leaf, because if it went into a new leaf, that leaf would be less than half-full.)
  uint leaves = size / (Leaf::NROWS / 2);

  // Calculate the worst-case number of parents to cover the leaves, given that a parent is always
  // at least half-full. Since the parents form a tree with branching factor B, the size of the
  // tree is N/B + N/B^2 + N/B^3 + N/B^4 + ... = N / (B - 1). Math.
  constexpr uint branchingFactor = Parent::NCHILDREN / 2;
  uint parents = leaves / (branchingFactor - 1);

  // Height is log-base-branching-factor of leaves, plus 1 for the root node.
  uint height = lg(leaves | 1) / lg(branchingFactor) + 1;

  size_t newSize = leaves +
      parents + 1 +  // + 1 for the root
      height + 2;    // minimum freelist size needed by insert()

  if (treeCapacity < newSize) {
    growTree(newSize);
  }
}